

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void background_work_sleep_once(tsdn_t *tsdn,background_thread_info_t *info,uint ind)

{
  arena_t *arena;
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint i;
  ulong addend;
  nstime_t before_sleep;
  timespec ts;
  nstime_t ts_wakeup;
  nstime_t next_wakeup;
  timeval tv;
  
  uVar1 = narenas_total_get();
  addend = 0xffffffffffffffff;
  for (; ind < uVar1; ind = ind + (int)max_background_threads) {
    arena = (arena_t *)arenas[ind].repr;
    uVar4 = addend;
    if (arena != (arena_t *)0x0) {
      arena_decay(tsdn,arena,true,false);
      uVar4 = 100000000;
      if (addend != 100000000) {
        uVar3 = arena_decay_compute_purge_interval_impl
                          (tsdn,&arena->decay_dirty,&arena->extents_dirty);
        uVar4 = 100000000;
        if ((uVar3 != 100000000) &&
           (uVar4 = arena_decay_compute_purge_interval_impl
                              (tsdn,&arena->decay_muzzy,&arena->extents_muzzy), uVar3 < uVar4)) {
          uVar4 = uVar3;
        }
        if (addend < uVar4) {
          uVar4 = addend;
        }
      }
    }
    addend = uVar4;
  }
  info->tot_n_runs = info->tot_n_runs + 1;
  info->npages_to_purge_new = 0;
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  nstime_init2(&before_sleep,tv.tv_sec,tv.tv_usec * 1000);
  if (addend == 0xffffffffffffffff) {
    pthread_cond_wait((pthread_cond_t *)&info->cond,
                      (pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x40));
  }
  else {
    nstime_init(&next_wakeup,0);
    nstime_update_impl(&next_wakeup);
    nstime_iadd(&next_wakeup,addend);
    uVar3 = nstime_ns(&next_wakeup);
    (info->indefinite_sleep).repr = uVar3 == 0xffffffffffffffff;
    nstime_init(&info->next_wakeup,uVar3);
    nstime_copy(&ts_wakeup,&before_sleep);
    nstime_iadd(&ts_wakeup,addend);
    ts.tv_sec = nstime_sec(&ts_wakeup);
    ts.tv_nsec = nstime_nsec(&ts_wakeup);
    pthread_cond_timedwait
              ((pthread_cond_t *)&info->cond,(pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x40),
               (timespec *)&ts);
    (info->indefinite_sleep).repr = true;
    nstime_init(&info->next_wakeup,0xffffffffffffffff);
  }
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  nstime_init2((nstime_t *)&ts,tv.tv_sec,tv.tv_usec * 1000);
  iVar2 = nstime_compare((nstime_t *)&ts,&before_sleep);
  if (0 < iVar2) {
    nstime_subtract((nstime_t *)&ts,&before_sleep);
    nstime_add(&info->tot_sleep_time,(nstime_t *)&ts);
  }
  return;
}

Assistant:

static inline void
background_work_sleep_once(tsdn_t *tsdn, background_thread_info_t *info, unsigned ind) {
	uint64_t min_interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
	unsigned narenas = narenas_total_get();

	for (unsigned i = ind; i < narenas; i += max_background_threads) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		arena_decay(tsdn, arena, true, false);
		if (min_interval == BACKGROUND_THREAD_MIN_INTERVAL_NS) {
			/* Min interval will be used. */
			continue;
		}
		uint64_t interval = arena_decay_compute_purge_interval(tsdn,
		    arena);
		assert(interval >= BACKGROUND_THREAD_MIN_INTERVAL_NS);
		if (min_interval > interval) {
			min_interval = interval;
		}
	}
	background_thread_sleep(tsdn, info, min_interval);
}